

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsPendulum_dns.c
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  int nout;
  N_Vector yref;
  N_Vector yy0;
  undefined8 *puVar5;
  void *cvode_mem;
  long lVar6;
  long lVar7;
  char *pcVar8;
  int iVar9;
  int local_84;
  double local_80;
  undefined1 local_78 [16];
  void *local_50;
  undefined1 local_48 [16];
  
  uVar3 = SUNContext_Create(0,&sunctx);
  if ((int)uVar3 < 0) {
    pcVar8 = "SUNContext_Create";
  }
  else {
    if (argc < 2) {
      local_78._8_8_ = 0x3ee4f8b588e368f1;
      local_78._0_8_ = 0x3ee4f8b588e368f1;
      local_80 = 30.0;
      nout = 1;
      local_84 = 1;
    }
    else {
      local_78._8_8_ = 0x3ee4f8b588e368f1;
      local_78._0_8_ = 0x3ee4f8b588e368f1;
      local_80 = 30.0;
      nout = 1;
      local_84 = 1;
      iVar9 = 1;
      do {
        pcVar8 = argv[iVar9];
        iVar4 = strcmp(pcVar8,"--tol");
        if (iVar4 == 0) {
          dVar1 = atof(argv[(long)iVar9 + 1]);
          dVar2 = atof(argv[(long)iVar9 + 2]);
          local_78._8_4_ = SUB84(dVar1,0);
          local_78._0_8_ = dVar2;
          local_78._12_4_ = (int)((ulong)dVar1 >> 0x20);
          iVar9 = iVar9 + 3;
        }
        else {
          iVar4 = strcmp(pcVar8,"--tf");
          if (iVar4 == 0) {
            local_80 = atof(argv[(long)iVar9 + 1]);
            iVar9 = iVar9 + 2;
          }
          else {
            iVar4 = strcmp(pcVar8,"--nout");
            if (iVar4 == 0) {
              nout = atoi(argv[(long)iVar9 + 1]);
              iVar9 = iVar9 + 2;
            }
            else {
              iVar4 = strcmp(pcVar8,"--noerrproj");
              if (iVar4 != 0) {
                main_cold_1();
                return 1;
              }
              local_84 = 0;
              iVar9 = iVar9 + 1;
            }
          }
        }
      } while (iVar9 < argc);
    }
    yref = (N_Vector)N_VNew_Serial(4,sunctx);
    uVar3 = RefSol(local_80,yref,nout);
    if ((int)uVar3 < 0) {
      pcVar8 = "RefSol";
    }
    else {
      yy0 = (N_Vector)N_VNew_Serial(4,sunctx);
      if (yy0 == (N_Vector)0x0) {
        main_cold_5();
        return 1;
      }
      puVar5 = (undefined8 *)N_VGetArrayPointer(yy0);
      *puVar5 = 0x3ff0000000000000;
      puVar5[1] = 0;
      puVar5[2] = 0;
      puVar5[3] = 0;
      cvode_mem = (void *)CVodeCreate(2,sunctx);
      local_50 = cvode_mem;
      if (cvode_mem == (void *)0x0) {
        main_cold_4();
        return 1;
      }
      uVar3 = CVodeInit(0,cvode_mem,f,yy0);
      if ((int)uVar3 < 0) {
        pcVar8 = "CVodeInit";
      }
      else {
        lVar6 = SUNDenseMatrix(4,4,sunctx);
        if (lVar6 == 0) {
          main_cold_3();
          return 1;
        }
        lVar7 = SUNLinSol_Dense(yy0,lVar6,sunctx);
        if (lVar7 == 0) {
          main_cold_2();
          return 1;
        }
        uVar3 = CVodeSetLinearSolver(cvode_mem,lVar7,lVar6);
        if ((int)uVar3 < 0) {
          pcVar8 = "CVodeSetLinearSolver";
        }
        else {
          uVar3 = CVodeSetProjFn(cvode_mem,proj);
          if ((int)uVar3 < 0) {
            pcVar8 = "CVodeSetProjFn";
          }
          else {
            uVar3 = CVodeSetMaxNumSteps(cvode_mem,50000);
            if ((int)uVar3 < 0) {
              pcVar8 = "CVodeSetMaxNumSteps";
            }
            else {
              iVar9 = 5;
              while( true ) {
                local_48._8_4_ = local_78._8_4_;
                local_48._0_8_ = local_78._8_8_;
                local_48._12_4_ = local_78._12_4_;
                printf("\n\nrtol = %8.2e, atol = %8.2e\n");
                printf("Project    x         y");
                printf("         x\'        y\'     |     g      |    ");
                puts("nst     rhs eval    setups (J eval)  |   cf   ef");
                uVar3 = GetSol(cvode_mem,yy0,(sunrealtype)local_48._0_8_,(sunrealtype)local_78._0_8_
                               ,local_80,nout,1,local_84,yref);
                if ((int)uVar3 < 0) break;
                uVar3 = GetSol(cvode_mem,yy0,(sunrealtype)local_48._0_8_,(sunrealtype)local_78._0_8_
                               ,local_80,nout,0,0,yref);
                if ((int)uVar3 < 0) break;
                local_78 = divpd(local_78,_DAT_00104020);
                iVar9 = iVar9 + -1;
                if (iVar9 == 0) {
                  N_VDestroy_Serial(yref);
                  N_VDestroy_Serial(yy0);
                  SUNMatDestroy(lVar6);
                  SUNLinSolFree(lVar7);
                  CVodeFree(&local_50);
                  SUNContext_Free(&sunctx);
                  return 0;
                }
              }
              pcVar8 = "GetSol";
            }
          }
        }
      }
    }
  }
  fprintf(_stderr,"\nERROR: %s() returned = %d\n\n",pcVar8,(ulong)uVar3);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  int i;
  int retval;                                  /* reusable return flag    */
  int nout               = 1;                  /* number of outputs       */
  sunrealtype rtol       = SUN_RCONST(1.0e-5); /* base relative tolerance */
  sunrealtype atol       = SUN_RCONST(1.0e-5); /* base absolute tolerance */
  sunrealtype tf         = SUN_RCONST(30.0);   /* final integration time  */
  sunbooleantype projerr = SUNTRUE;            /* enable error projection */

  void* cvode_mem      = NULL; /* CVODES memory             */
  N_Vector yy0         = NULL; /* initial condition vector  */
  sunrealtype* yy0data = NULL; /* vector data               */
  N_Vector yref        = NULL; /* reference solution vector */
  SUNMatrix A          = NULL; /* Jacobian matrix           */
  SUNLinearSolver LS   = NULL; /* linear solver             */

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Read command line inputs */
  retval = ReadInputs(&argc, &argv, &rtol, &atol, &tf, &nout, &projerr);
  if (check_retval(&retval, "ReadInputs", 1)) { return (1); }

  /* Compute reference solution */
  yref = N_VNew_Serial(4, sunctx);

  retval = RefSol(tf, yref, nout);
  if (check_retval(&retval, "RefSol", 1)) { return (1); }

  /* Create serial vector to store the initial condition */
  yy0 = N_VNew_Serial(4, sunctx);
  if (check_retval((void*)yy0, "N_VNew_Serial", 0)) { return (1); }

  /* Set the initial condition values */
  yy0data = N_VGetArrayPointer(yy0);

  yy0data[0] = ONE;  /* x  */
  yy0data[1] = ZERO; /* y  */
  yy0data[2] = ZERO; /* xd */
  yy0data[3] = ZERO; /* yd */

  /* Create CVODES memory */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Initialize CVODES */
  retval = CVodeInit(cvode_mem, f, ZERO, yy0);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(4, 4, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy0, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver to CVODES */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set a user-supplied projection function */
  retval = CVodeSetProjFn(cvode_mem, proj);
  if (check_retval(&retval, "CVodeSetProjFn", 1)) { return (1); }

  /* Set maximum number of steps between outputs */
  retval = CVodeSetMaxNumSteps(cvode_mem, 50000);
  if (check_retval(&retval, "CVodeSetMaxNumSteps", 1)) { return (1); }

  /* Compute the solution with various tolerances */
  for (i = 0; i < 5; i++)
  {
    /* Output tolerance and output header for this run */
    printf("\n\nrtol = %8.2" ESYM ", atol = %8.2" ESYM "\n", rtol, atol);
    printf("Project    x         y");
    printf("         x'        y'     |     g      |    ");
    printf("nst     rhs eval    setups (J eval)  |   cf   ef\n");

    /* Compute solution with projection */
    retval = GetSol(cvode_mem, yy0, rtol, atol, tf, nout, SUNTRUE, projerr, yref);
    if (check_retval(&retval, "GetSol", 1)) { return (1); }

    /* Compute solution without projection */
    retval = GetSol(cvode_mem, yy0, rtol, atol, tf, nout, SUNFALSE, SUNFALSE,
                    yref);
    if (check_retval(&retval, "GetSol", 1)) { return (1); }

    /* Reduce tolerance for next run */
    rtol /= SUN_RCONST(10.0);
    atol /= SUN_RCONST(10.0);
  }

  /* Free memory */
  N_VDestroy_Serial(yref);
  N_VDestroy_Serial(yy0);
  SUNMatDestroy(A);
  SUNLinSolFree(LS);
  CVodeFree(&cvode_mem);
  SUNContext_Free(&sunctx);

  return (0);
}